

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ImfRgbaFile.cpp
# Opt level: O0

void __thiscall Imf_2_5::RgbaInputFile::FromYca::rotateBuf1(FromYca *this,int d)

{
  long in_RDI;
  int i_1;
  int i;
  Rgba *tmp [29];
  int in_stack_ffffffffffffff00;
  int in_stack_ffffffffffffff04;
  int iVar1;
  undefined8 auStack_f8 [29];
  int local_c;
  
  local_c = Imath_2_5::modp(in_stack_ffffffffffffff04,in_stack_ffffffffffffff00);
  for (iVar1 = 0; iVar1 < 0x1d; iVar1 = iVar1 + 1) {
    auStack_f8[iVar1] = *(undefined8 *)(in_RDI + 0x68 + (long)iVar1 * 8);
  }
  for (iVar1 = 0; iVar1 < 0x1d; iVar1 = iVar1 + 1) {
    *(undefined8 *)(in_RDI + 0x68 + (long)iVar1 * 8) = auStack_f8[(iVar1 + local_c) % 0x1d];
  }
  return;
}

Assistant:

void
RgbaInputFile::FromYca::rotateBuf1 (int d)
{
    d = modp (d, N + 2);

    Rgba *tmp[N + 2];

    for (int i = 0; i < N + 2; ++i)
	tmp[i] = _buf1[i];

    for (int i = 0; i < N + 2; ++i)
	_buf1[i] = tmp[(i + d) % (N + 2)];
}